

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O3

void * benchmark_thread(void *param)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uintptr_t current;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  timeval end;
  timeval start;
  cpu_set_t target_cpu_set;
  char buf [4096];
  code *local_10e8;
  timeval local_10d8;
  timeval local_10c8;
  cpu_set_t local_10b8;
  undefined1 local_1038 [4104];
  
  local_10b8.__bits[0] = 0;
  local_10b8.__bits[1] = 0;
  local_10b8.__bits[2] = 0;
  local_10b8.__bits[3] = 0;
  local_10b8.__bits[4] = 0;
  local_10b8.__bits[5] = 0;
  local_10b8.__bits[6] = 0;
  local_10b8.__bits[7] = 0;
  local_10b8.__bits[8] = 0;
  local_10b8.__bits[9] = 0;
  local_10b8.__bits[10] = 0;
  local_10b8.__bits[0xb] = 0;
  local_10b8.__bits[0xc] = 0;
  local_10b8.__bits[0xd] = 0;
  local_10b8.__bits[0xe] = 0;
  local_10b8.__bits[0xf] = 0;
  uVar1 = *(uint *)((long)param + 0x28);
  if (uVar1 < 0x400) {
    local_10b8.__bits[uVar1 >> 6] = local_10b8.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
  }
  pthread_setaffinity_np(*(pthread_t *)((long)param + 8),0x80,&local_10b8);
  fprintf(_stdout,"%s: start on cpu %d, address %#lx, size %lu, len %lu\n","benchmark_thread",
          (ulong)*(uint *)((long)param + 0x28),*(undefined8 *)((long)param + 0x30),
          *(undefined8 *)((long)param + 0x38),*(undefined8 *)(*param + 0x20));
  iVar2 = *(int *)(*param + 0xc);
  if (iVar2 == 0) {
    local_10e8 = dma_read;
    uVar6 = 0x800;
  }
  else {
    if (iVar2 != 1) {
      benchmark_thread_cold_2();
      return (void *)0x0;
    }
    local_10e8 = dma_write;
    uVar6 = 0x100;
  }
  if (caught_signal == '\0') {
    uVar7 = *(ulong *)(*param + 0x20);
    current = *(uintptr_t *)((long)param + 0x30);
    do {
      if (debug == '\x01') {
        fprintf(_stdout,"%s:DEBUG: DMA to %#lx, cpu %d\n","benchmark_thread",current,
                (ulong)*(uint *)((long)param + 0x28));
      }
      uVar5 = uVar6;
      if (uVar7 < uVar6) {
        uVar5 = uVar7;
      }
      if (tlpperf->latency_mode != 0) {
        gettimeofday(&local_10c8,(__timezone_ptr_t)0x0);
      }
      lVar3 = (*local_10e8)((long)param + 0x10,current,local_1038,uVar5);
      if (tlpperf->latency_mode != 0) {
        gettimeofday(&local_10d8,(__timezone_ptr_t)0x0);
      }
      if (lVar3 < 0) {
        benchmark_thread_cold_1();
        return (void *)0x0;
      }
      if (tlpperf->latency_mode != 0) {
        lVar4 = local_10d8.tv_usec + 1000000;
        if (local_10c8.tv_usec <= local_10d8.tv_usec) {
          lVar4 = local_10d8.tv_usec;
        }
        printf("latency: cpu on %d, %lu usec\n",(ulong)*(uint *)((long)param + 0x28),
               (lVar4 - local_10c8.tv_usec) +
               ((local_10d8.tv_sec - local_10c8.tv_sec) -
               (ulong)(local_10d8.tv_usec < local_10c8.tv_usec)) * 1000000);
      }
      *(long *)((long)param + 0x40) = *(long *)((long)param + 0x40) + 1;
      *(long *)((long)param + 0x48) = *(long *)((long)param + 0x48) + lVar3;
      current = next_target_addr(current,*(uintptr_t *)((long)param + 0x30),
                                 *(long *)((long)param + 0x38) + *(uintptr_t *)((long)param + 0x30),
                                 *(size_t *)(*param + 0x20),*(int *)(*param + 0x30));
      uVar7 = uVar7 - lVar3;
      if (uVar7 == 0) {
        uVar7 = *(ulong *)(*param + 0x20);
      }
      if ((0 < *(int *)((long)param + 0x50)) &&
         (iVar2 = *(int *)((long)param + 0x50) + -1, *(int *)((long)param + 0x50) = iVar2,
         iVar2 == 0)) {
        return (void *)0x0;
      }
      if (*(int *)(*param + 0x3c) != 0) {
        usleep(*(int *)(*param + 0x3c) * 1000);
      }
    } while (caught_signal != '\x01');
  }
  return (void *)0x0;
}

Assistant:

void *benchmark_thread(void *param)
{
	struct tlpperf_thread *th = param;
	uintptr_t addr;
	size_t dma_len, one_dma_len, len;
	ssize_t ret;
	char buf[MRRS * 2];	/* x2 is just a buffer */
	cpu_set_t target_cpu_set;
	ssize_t (*dma)(struct nettlp *nt, uintptr_t addr,
		       void *buf, size_t count);
	struct timeval start, end;	/* for latency mode */

	CPU_ZERO(&target_cpu_set);
	CPU_SET(th->cpu, &target_cpu_set);
	pthread_setaffinity_np(th->tid, sizeof(cpu_set_t), &target_cpu_set);

	pr_info("start on cpu %d, address %#lx, size %lu, len %lu\n",
		th->cpu, th->region_addr, th->region_size, th->t->dma_len);

	switch (th->t->direction) {
	case DMA_DIRECTION_READ:
		one_dma_len = MRRS;
		dma = dma_read;
		break;
	case DMA_DIRECTION_WRITE:
		one_dma_len = MPS;
		dma = dma_write;
		break;
	default:
		pr_err("invalid direction on cpu %d\n", th->cpu);
		return NULL;
	}

	addr = th->region_addr;
	dma_len = th->t->dma_len;

	while (1) {

		if (caught_signal)
			break;

		pr_debug("DMA to %#lx, cpu %d\n", addr, th->cpu);

		len = dma_len < one_dma_len ? dma_len : one_dma_len;

		if (tlpperf->latency_mode)
			gettimeofday(&start, NULL);

		ret = dma(&th->nt, addr, buf, len);

		if (tlpperf->latency_mode)
			gettimeofday(&end, NULL);

		if (ret < 0) {
			fprintf(stderr,
				"dma error on cpu %d. "
				"addr %#lx, len %lu: %s\n",
				th->cpu, addr, len, strerror(errno));
			return NULL;
			goto next;
		}

		if (tlpperf->latency_mode) {
			printf("latency: cpu on %d, %lu usec\n",
			       th->cpu, get_usec_elapsed(start, end));
		}

		th->ntrans++;
		th->nbytes += ret;
		dma_len -= ret;
		addr = next_target_addr(addr, th->region_addr,
					th->region_addr + th->region_size,
					th->t->dma_len, th->t->pattern);

		if (dma_len == 0) {
			/* 1 transaction finished */
			dma_len = th->t->dma_len;
		}

	next:
		if (th->count > 0) {
			th->count--;
			if (th->count == 0)
				break;
		}

		if (th->t->interval)
			usleep(th->t->interval * 1000);
	}

	return NULL;
}